

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *
math::wide_integer::operator-
          (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *__return_storage_ptr__,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *u,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *v)

{
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *other;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_38;
  
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&local_38,
             (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)u);
  local_38._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
  other = (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::operator-=
                    ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&local_38,v);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             __return_storage_ptr__,other);
  (__return_storage_ptr__->values).
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002088d0;
  local_38._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_38.elem_count != 0) {
    operator_delete(local_38.elems,(ulong)local_38.elem_count << 2);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto operator- (const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& v) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned> { return uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(u).operator-=(v); }